

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  bool bVar2;
  Limit limit;
  int iVar3;
  uint32_t first_byte_or_zero;
  int64_t iVar4;
  ulong uVar5;
  int *piVar6;
  byte *pbVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  byte *ptr;
  int value;
  ulong unaff_R13;
  bool bVar13;
  
  pbVar7 = input->buffer_;
  if (pbVar7 < input->buffer_end_) {
    uVar12 = (uint)*pbVar7;
    if (-1 < (char)*pbVar7) {
      input->buffer_ = pbVar7 + 1;
      bVar13 = true;
      goto LAB_0033b5c4;
    }
  }
  else {
    uVar12 = 0;
  }
  iVar4 = io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
  uVar12 = (uint)iVar4;
  bVar13 = -1 < iVar4;
LAB_0033b5c4:
  if (bVar13) {
    limit = io::CodedInputStream::PushLimit(input,uVar12);
    uVar12 = field_number << 3;
    do {
      iVar3 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar3 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar5 = (ulong)bVar1;
        first_byte_or_zero = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_0033b629;
        input->buffer_ = pbVar7 + 1;
        bVar13 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_0033b629:
        uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar13 = -1 < (long)uVar5;
      }
      uVar11 = unaff_R13;
      if (bVar13) {
        uVar11 = uVar5;
      }
      unaff_R13 = uVar11 & 0xffffffff;
      if (!bVar13) {
        return false;
      }
      uVar10 = (uint)uVar11;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar2 = (*is_valid)(uVar10), bVar2)) {
        uVar8 = values->current_size_;
        if (uVar8 == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        piVar6 = RepeatedField<int>::elements(values);
        piVar6[uVar8] = uVar10;
        values->current_size_ = uVar8 + 1;
      }
      else {
        pbVar7 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        *pbVar7 = (byte)uVar12;
        if (uVar12 < 0x80) {
          ptr = pbVar7 + 1;
        }
        else {
          ptr = pbVar7 + 2;
          *pbVar7 = (byte)uVar12 | 0x80;
          pbVar7[1] = (byte)(uVar12 >> 7);
          if (0x3fff < uVar12) {
            uVar9 = (uint)pbVar7[1];
            uVar8 = uVar12 >> 7;
            do {
              ptr[-1] = (byte)uVar9 | 0x80;
              uVar9 = uVar8 >> 7;
              *ptr = (byte)uVar9;
              ptr = ptr + 1;
              bVar2 = 0x3fff < uVar8;
              uVar8 = uVar9;
            } while (bVar2);
          }
        }
        unknown_fields_stream->cur_ = ptr;
        if ((unknown_fields_stream->impl_).end_ <= ptr) {
          ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&unknown_fields_stream->impl_,ptr);
        }
        unknown_fields_stream->cur_ = ptr;
        *ptr = (byte)unaff_R13;
        if (uVar10 < 0x80) {
          pbVar7 = ptr + 1;
        }
        else {
          *ptr = (byte)unaff_R13 | 0x80;
          ptr[1] = (byte)(unaff_R13 >> 7);
          pbVar7 = ptr + 2;
          if (0x3fff < uVar10) {
            uVar5 = (ulong)ptr[1];
            uVar11 = unaff_R13 >> 7;
            do {
              pbVar7[-1] = (byte)uVar5 | 0x80;
              uVar5 = uVar11 >> 7;
              *pbVar7 = (byte)uVar5;
              pbVar7 = pbVar7 + 1;
              uVar10 = (uint)uVar11;
              uVar11 = uVar5;
            } while (0x3fff < uVar10);
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
      }
    } while (bVar13);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      uint32_t tag = WireFormatLite::MakeTag(field_number,
                                             WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}